

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O1

void os_interface_linux_remove(os_interface_listener *if_listener)

{
  uint32_t *puVar1;
  os_interface *data;
  list_entity *plVar2;
  list_entity *plVar3;
  
  if (if_listener->data != (os_interface *)0x0) {
    if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,_oonf_os_interface_subsystem.logging,
               "src/base/os_linux/os_interface_linux.c",0x162,(void *)0x0,0,
               "Remove interface from tracking: %s",if_listener->name);
    }
    if (if_listener->mesh == true) {
      puVar1 = &(if_listener->data->_internal).mesh_counter;
      *puVar1 = *puVar1 - 1;
      if ((if_listener->data->_internal).mesh_counter == 0) {
        _cleanup_mesh(if_listener->data);
      }
    }
    data = if_listener->data;
    plVar2 = (if_listener->_node).next;
    if_listener->data = (os_interface *)0x0;
    plVar3 = (if_listener->_node).prev;
    plVar3->next = plVar2;
    plVar2->prev = plVar3;
    (if_listener->_node).next = (list_entity *)0x0;
    (if_listener->_node).prev = (list_entity *)0x0;
    _remove_interface(data);
    return;
  }
  return;
}

Assistant:

void
os_interface_linux_remove(struct os_interface_listener *if_listener) {
  struct os_interface *data;

  if (!if_listener->data) {
    /* interface not hooked up to data */
    return;
  }

  OONF_INFO(LOG_OS_INTERFACE, "Remove interface from tracking: %s", if_listener->name);

  if (if_listener->mesh) {
    if_listener->data->_internal.mesh_counter--;
    if (!if_listener->data->_internal.mesh_counter) {
      _cleanup_mesh(if_listener->data);
    }
  }

  /* unhook from interface data */
  data = if_listener->data;
  if_listener->data = NULL;
  list_remove(&if_listener->_node);

  /* remove interface if not used anymore */
  _remove_interface(data);
}